

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.cpp
# Opt level: O3

double Js::JavascriptNumber::DirectPow(double x,double y)

{
  double dVar1;
  bool bVar2;
  uint32 *puVar3;
  double local_10;
  double y_local;
  
  if ((y != 1.0) || (NAN(y))) {
    local_10 = y;
    puVar3 = NumberUtilities::LuLoDbl(&local_10);
    if ((*puVar3 == 0) &&
       (puVar3 = NumberUtilities::LuHiDbl(&local_10), (*puVar3 & 0x7fffffff) == 0)) {
      x = 1.0;
    }
    else if (((ABS(x) != 1.0) || (NAN(ABS(x)))) ||
            (bVar2 = NumberUtilities::IsFinite(local_10), bVar2)) {
      dVar1 = local_10;
      if (((local_10 != (double)(int)local_10) || (NAN(local_10) || NAN((double)(int)local_10))) ||
         (bVar2 = NumberUtilities::IsSpecial(local_10,0x8000000000000000), bVar2)) {
        x = pow(x,local_10);
      }
      else {
        x = DirectPowDoubleInt(x,(int)dVar1);
      }
    }
    else {
      x = NAN;
    }
  }
  return x;
}

Assistant:

double JavascriptNumber::DirectPow(double x, double y)
    {
        if(y == 1.0)
        {
            return x;
        }

        // For AMD64/ARM calling convention already uses SSE2/VFP registers so we don't have to use assembler.
        // We can't just use "if (0 == y)" because NaN compares
        // equal to 0 according to our compilers.
        int32 intY;
        if (0 == NumberUtilities::LuLoDbl(y) && 0 == (NumberUtilities::LuHiDbl(y) & 0x7FFFFFFF))
        {
            // pow(x, 0) = 1 even if x is NaN.
            return 1;
        }
        else if (1.0 == fabs(x) && !NumberUtilities::IsFinite(y))
        {
            // pow([+/-] 1, Infinity) = NaN according to javascript, but not for CRT pow.
            return JavascriptNumber::NaN;
        }
        else if (TryGetInt32Value(y, &intY))
        {
            // check fast path
            return DirectPowDoubleInt(x, intY);
        }

        return ::pow(x, y);
    }